

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O2

int run_test_process_title_big_argv(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_1;
  int64_t eval_a_1;
  size_t exepath_size;
  uv_process_t process;
  char *args [5];
  code *local_668;
  char *local_660;
  char **local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  char jumbo [512];
  char exepath [1024];
  
  iVar1 = uv_exepath(exepath);
  eval_a_1 = (int64_t)iVar1;
  process.data = (void *)0x0;
  jumbo._0_8_ = eval_a_1;
  if (eval_a_1 == 0) {
    exepath[0x3ff] = '\0';
    memset(jumbo,0x78,0x1ff);
    jumbo[0x1ff] = '\0';
    local_658 = args;
    args[1] = "process_title_big_argv_helper";
    args[4] = (char *)0x0;
    local_650 = 0;
    uStack_648 = 0;
    local_640 = 0;
    uStack_638 = 0;
    local_630 = 0;
    uStack_628 = 0;
    local_620 = 0;
    local_668 = exit_cb;
    args[0] = exepath;
    args[2] = jumbo;
    args[3] = jumbo;
    local_660 = exepath;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&local_668);
    eval_a_1 = (int64_t)iVar1;
    eval_b_1 = 0;
    if (eval_a_1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      eval_a_1 = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_a_1 == 0) {
        uVar2 = uv_default_loop();
        uv_walk(uVar2,close_walk_cb,0);
        uv_run(uVar2,0);
        eval_a_1 = 0;
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        eval_b_1 = (int64_t)iVar1;
        if (eval_b_1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar4 = "uv_loop_close(uv_default_loop())";
        pcVar3 = "0";
        uVar2 = 0x7b;
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar2 = 0x79;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_spawn(uv_default_loop(), &process, &options)";
      uVar2 = 0x78;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_exepath(exepath, &exepath_size)";
    uVar2 = 100;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a_1,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(process_title_big_argv) {
  uv_process_options_t options;
  uv_process_t process;
  size_t exepath_size;
  char exepath[1024];
  char jumbo[512];
  char* args[5];

#ifdef _WIN32
  /* Remove once https://github.com/libuv/libuv/issues/2667 is fixed. */
  uv_set_process_title("run-tests");
#endif

  exepath_size = sizeof(exepath) - 1;
  ASSERT_OK(uv_exepath(exepath, &exepath_size));
  exepath[exepath_size] = '\0';

  memset(jumbo, 'x', sizeof(jumbo) - 1);
  jumbo[sizeof(jumbo) - 1] = '\0';

  /* Note: need to pass three arguments, not two, otherwise
   * run-tests.c thinks it's the name of a test to run.
   */
  args[0] = exepath;
  args[1] = "process_title_big_argv_helper";
  args[2] = jumbo;
  args[3] = jumbo;
  args[4] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}